

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void * mi_heap_try_new(mi_heap_t *heap,size_t size,_Bool nothrow)

{
  long lVar1;
  _Bool _Var2;
  undefined8 *puVar3;
  size_t idx;
  
  _Var2 = mi_try_new_handler(nothrow);
  if (_Var2) {
    do {
      if (size < 0x401) {
        lVar1 = *(long *)((long)heap->pages_free_direct + (size + 7 & 0xfffffffffffffff8));
        puVar3 = *(undefined8 **)(lVar1 + 0x10);
        if (puVar3 == (undefined8 *)0x0) goto LAB_00479cc4;
        *(undefined8 *)(lVar1 + 0x10) = *puVar3;
        *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      }
      else {
LAB_00479cc4:
        puVar3 = (undefined8 *)_mi_malloc_generic(heap,size,false,0);
      }
    } while ((puVar3 == (undefined8 *)0x0) && (_Var2 = mi_try_new_handler(nothrow), _Var2));
  }
  else {
    puVar3 = (undefined8 *)0x0;
  }
  return puVar3;
}

Assistant:

void* mi_heap_try_new(mi_heap_t* heap, size_t size, bool nothrow ) {
  void* p = NULL;
  while(p == NULL && mi_try_new_handler(nothrow)) {
    p = mi_heap_malloc(heap,size);
  }
  return p;
}